

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O1

void __thiscall gimage::View::View(View *this)

{
  (this->image).depth = 0;
  (this->image).width = 0;
  (this->image).height = 0;
  (this->image).n = 0;
  (this->image).pixel = (uchar *)0x0;
  (this->image).row = (uchar **)0x0;
  (this->image).img = (uchar ***)0x0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(&this->image,0,0,1);
  (this->depth).depth = 0;
  (this->depth).width = 0;
  (this->depth).height = 0;
  (this->depth).n = 0;
  (this->depth).pixel = (float *)0x0;
  (this->depth).row = (float **)0x0;
  (this->depth).img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&this->depth,0,0,1);
  this->camera = (Camera *)0x0;
  this->step = 1.0;
  return;
}

Assistant:

View::View()
{
  camera=0;
  step=1;
}